

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void update_itemlist_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  term_conflict *inv_term;
  term_conflict *old;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  t = Term;
  Term_activate((term *)user);
  clear_from(L'\0');
  object_list_show_subwindow(Term->hgt,Term->wid);
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_itemlist_subwindow(game_event_type type,
									  game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;

	/* Activate */
	Term_activate(inv_term);

    clear_from(0);
    object_list_show_subwindow(Term->hgt, Term->wid);
	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}